

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase302::run(TestCase302 *this)

{
  Reader reader;
  bool bVar1;
  Reader *value;
  ArrayDisposer **value_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar2;
  Maybe<capnp::MessageSize> *pMVar3;
  ArrayPtr<const_char> AVar4;
  undefined8 in_stack_fffffffffffff918;
  int local_6a8;
  bool local_6a1;
  int local_6a0;
  bool _kj_shouldLog_4;
  SegmentReader *pSStack_698;
  bool _kj_shouldLog_3;
  SegmentReader *pSStack_690;
  CapTableReader *local_688;
  void *pvStack_680;
  WirePointer *local_678;
  StructDataBitCount SStack_670;
  StructPointerCount SStack_66c;
  undefined2 uStack_66a;
  undefined1 auStack_668 [8];
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  Reader local_618;
  ArrayPtr<const_char> local_5d0;
  bool local_5b9;
  undefined1 auStack_5b8 [7];
  bool _kj_shouldLog_2;
  Reader local_5a8;
  ArrayPtr<const_char> local_560;
  undefined1 local_550 [8];
  Response<capnp::DynamicStruct> response;
  int local_500;
  bool _kj_shouldLog_1;
  undefined1 local_4f8 [7];
  bool _kj_shouldLog;
  undefined1 local_4b8 [8];
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Client local_468;
  undefined1 local_450 [8];
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  RemotePromise<capnp::DynamicStruct> pipelinePromise;
  ArrayPtr<const_char> local_390;
  Maybe<capnp::MessageSize> local_380;
  ArrayPtr<const_char> local_368;
  undefined1 local_358 [8];
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> pipelineRequest;
  ArrayPtr<const_char> local_300;
  Pipeline local_2f0;
  PipelineFor<capnp::DynamicStruct> local_2b8;
  Pipeline local_288;
  undefined1 local_250 [8];
  PipelineFor<capnp::DynamicCapability> outCap;
  RemotePromise<capnp::DynamicStruct> promise;
  Client local_1e8;
  Reader local_1d0;
  ArrayPtr<const_char> local_188;
  Reader local_178;
  ArrayPtr<const_char> local_130;
  Maybe<capnp::MessageSize> local_120;
  ArrayPtr<const_char> local_108;
  undefined1 local_f8 [8];
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request;
  Client local_a0;
  undefined1 local_88 [8];
  Client client;
  int local_68;
  int chainedCallCount;
  int callCount;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase302 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  local_68 = 0;
  client.schema.super_Schema.raw._4_4_ = 0;
  kj::heap<capnp::_::TestPipelineImpl,int&>((kj *)&request.resultSchema,&local_68);
  capnproto_test::capnp::test::TestPipeline::Client::Client<capnp::_::TestPipelineImpl,void>
            (&local_a0,(Own<capnp::_::TestPipelineImpl> *)&request.resultSchema);
  DynamicCapability::Client::Client<capnproto_test::capnp::test::TestPipeline::Client,void>
            ((Client *)local_88,&local_a0);
  capnproto_test::capnp::test::TestPipeline::Client::~Client(&local_a0);
  kj::Own<capnp::_::TestPipelineImpl>::~Own
            ((Own<capnp::_::TestPipelineImpl> *)&request.resultSchema);
  kj::StringPtr::StringPtr((StringPtr *)&local_108,"getCap");
  kj::Maybe<capnp::MessageSize>::Maybe(&local_120,(void *)0x0);
  pMVar3 = &local_120;
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_f8,(Client *)local_88,
             (StringPtr)local_108,pMVar3);
  iVar2 = (int)pMVar3;
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_120);
  kj::StringPtr::StringPtr((StringPtr *)&local_130,"n");
  DynamicValue::Reader::Reader(&local_178,0xea);
  DynamicStruct::Builder::set((Builder *)local_f8,(StringPtr)local_130,&local_178);
  DynamicValue::Reader::~Reader(&local_178);
  kj::StringPtr::StringPtr((StringPtr *)&local_188,"inCap");
  kj::heap<capnp::_::TestInterfaceImpl,int&>
            ((kj *)&promise.super_Pipeline.typeless.ops.disposer,
             (int *)((long)&client.schema.super_Schema.raw + 4));
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            (&local_1e8,
             (Own<capnp::_::TestInterfaceImpl> *)&promise.super_Pipeline.typeless.ops.disposer);
  DynamicValue::Reader::
  Reader<capnproto_test::capnp::test::TestInterface::Client,capnp::DynamicCapability::Client>
            (&local_1d0,&local_1e8);
  value = &local_1d0;
  DynamicStruct::Builder::set((Builder *)local_f8,(StringPtr)local_188,value);
  DynamicValue::Reader::~Reader(&local_1d0);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_1e8);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own
            ((Own<capnp::_::TestInterfaceImpl> *)&promise.super_Pipeline.typeless.ops.disposer);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)&outCap.schema,(int)local_f8,
             __buf,(size_t)value,iVar2);
  kj::StringPtr::StringPtr((StringPtr *)&local_300,"outBox");
  DynamicStruct::Pipeline::get
            (&local_2f0,
             (Pipeline *)
             &promise.super_Promise<capnp::Response<capnp::DynamicStruct>_>.super_PromiseBase.node.
              ptr,(StringPtr)local_300);
  DynamicValue::Pipeline::releaseAs<capnp::DynamicStruct>(&local_2b8,&local_2f0);
  kj::StringPtr::StringPtr((StringPtr *)&pipelineRequest.resultSchema,"cap");
  DynamicStruct::Pipeline::get(&local_288,&local_2b8,(StringPtr)stack0xfffffffffffffcf0);
  DynamicValue::Pipeline::releaseAs<capnp::DynamicCapability>
            ((PipelineFor<capnp::DynamicCapability> *)local_250,&local_288);
  DynamicValue::Pipeline::~Pipeline(&local_288);
  DynamicStruct::Pipeline::~Pipeline(&local_2b8);
  DynamicValue::Pipeline::~Pipeline(&local_2f0);
  kj::StringPtr::StringPtr((StringPtr *)&local_368,"foo");
  kj::Maybe<capnp::MessageSize>::Maybe(&local_380,(void *)0x0);
  pMVar3 = &local_380;
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_358,(Client *)local_250,
             (StringPtr)local_368,pMVar3);
  iVar2 = (int)pMVar3;
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_380);
  kj::StringPtr::StringPtr((StringPtr *)&local_390,"i");
  DynamicValue::Reader::Reader
            ((Reader *)&pipelinePromise.super_Pipeline.typeless.ops.disposer,0x141);
  value_00 = &pipelinePromise.super_Pipeline.typeless.ops.disposer;
  DynamicStruct::Builder::set((Builder *)local_358,(StringPtr)local_390,(Reader *)value_00);
  DynamicValue::Reader::~Reader((Reader *)&pipelinePromise.super_Pipeline.typeless.ops.disposer);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)&pipelineRequest2.hook.ptr,
             (int)local_358,__buf_00,(size_t)value_00,iVar2);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            (&local_468,(Client *)local_250);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise2.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_450,&local_468,
             (Maybe<capnp::MessageSize> *)&pipelinePromise2.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise2.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestExtends::Client::~Client(&local_468);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_4b8,(int)local_450,__buf_01,(size_t)value_00,iVar2);
  RemotePromise<capnp::DynamicStruct>::RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)local_4f8,(void *)0x0);
  RemotePromise<capnp::DynamicStruct>::operator=
            ((RemotePromise<capnp::DynamicStruct> *)&outCap.schema,
             (RemotePromise<capnp::DynamicStruct> *)local_4f8);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)local_4f8);
  if (local_68 != 0) {
    _kj_shouldLog_1 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_1 != false) {
      local_500 = 0;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x148,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",&local_500,&local_68);
      _kj_shouldLog_1 = false;
    }
  }
  if (client.schema.super_Schema.raw._4_4_ != 0) {
    response.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)response.hook.ptr._7_1_ != false) {
      response.hook.ptr._0_4_ = 0;
      kj::_::Debug::log<char_const(&)[43],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x149,ERROR,
                 "\"failed: expected \" \"(0) == (chainedCallCount)\", 0, chainedCallCount",
                 (char (*) [43])"failed: expected (0) == (chainedCallCount)",
                 (int *)&response.hook.ptr,(int *)((long)&client.schema.super_Schema.raw + 4));
      response.hook.ptr._7_1_ = false;
    }
  }
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::wait
            ((Promise<capnp::Response<capnp::DynamicStruct>_> *)local_550,&pipelineRequest2.hook.ptr
            );
  kj::StringPtr::StringPtr((StringPtr *)auStack_5b8,"x");
  DynamicStruct::Reader::get(&local_5a8,(Reader *)local_550,(StringPtr)_auStack_5b8);
  local_560 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_5a8);
  bVar1 = kj::operator==("bar",(StringPtr *)&local_560);
  DynamicValue::Reader::~Reader(&local_5a8);
  if (!bVar1) {
    local_5b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5b9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&response2.hook.ptr,"x");
      DynamicStruct::Reader::get(&local_618,(Reader *)local_550,(StringPtr)stack0xfffffffffffff9d8);
      AVar4 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_618);
      local_5d0 = AVar4;
      kj::_::Debug::log<char_const(&)[59],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x14c,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (response.get(\\\"x\\\").as<Text>())\", \"bar\", response.get(\"x\").as<Text>()"
                 ,(char (*) [59])"failed: expected (\"bar\") == (response.get(\"x\").as<Text>())",
                 (char (*) [4])0xa54964,(Reader *)&local_5d0);
      DynamicValue::Reader::~Reader(&local_618);
      local_5b9 = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)auStack_668,
             local_4b8);
  local_678 = response2.super_Reader._reader.pointers;
  SStack_670 = response2.super_Reader._reader.dataSize;
  SStack_66c = response2.super_Reader._reader.pointerCount;
  uStack_66a = response2.super_Reader._reader._38_2_;
  local_688 = response2.super_Reader._reader.capTable;
  pvStack_680 = response2.super_Reader._reader.data;
  pSStack_698 = (SegmentReader *)auStack_668;
  pSStack_690 = response2.super_Reader._reader.segment;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader._40_8_ = in_stack_fffffffffffff918;
  checkTestMessage(reader);
  if (local_68 != 3) {
    _kj_shouldLog_4 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      local_6a0 = 3;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x151,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
                 (char (*) [36])"failed: expected (3) == (callCount)",&local_6a0,&local_68);
      _kj_shouldLog_4 = false;
    }
  }
  if (client.schema.super_Schema.raw._4_4_ != 1) {
    local_6a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6a1 != false) {
      local_6a8 = 1;
      kj::_::Debug::log<char_const(&)[43],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x152,ERROR,
                 "\"failed: expected \" \"(1) == (chainedCallCount)\", 1, chainedCallCount",
                 (char (*) [43])"failed: expected (1) == (chainedCallCount)",&local_6a8,
                 (int *)((long)&client.schema.super_Schema.raw + 4));
      local_6a1 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestAllTypes>::~Response
            ((Response<capnproto_test::capnp::test::TestAllTypes> *)auStack_668);
  Response<capnp::DynamicStruct>::~Response((Response<capnp::DynamicStruct> *)local_550);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestAllTypes> *)local_4b8);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::~Request((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_450);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)&pipelineRequest2.hook.ptr);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::~Request
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_358);
  DynamicCapability::Client::~Client((Client *)local_250);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)&outCap.schema);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::~Request
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_f8);
  DynamicCapability::Client::~Client((Client *)local_88);
  kj::WaitScope::~WaitScope((WaitScope *)local_58);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, DynamicClientPipelining) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  int chainedCallCount = 0;
  DynamicCapability::Client client =
      test::TestPipeline::Client(kj::heap<TestPipelineImpl>(callCount));

  auto request = client.newRequest("getCap");
  request.set("n", 234);
  request.set("inCap", test::TestInterface::Client(kj::heap<TestInterfaceImpl>(chainedCallCount)));

  auto promise = request.send();

  auto outCap = promise.get("outBox").releaseAs<DynamicStruct>()
                       .get("cap").releaseAs<DynamicCapability>();
  auto pipelineRequest = outCap.newRequest("foo");
  pipelineRequest.set("i", 321);
  auto pipelinePromise = pipelineRequest.send();

  auto pipelineRequest2 = outCap.castAs<test::TestExtends>().graultRequest();
  auto pipelinePromise2 = pipelineRequest2.send();

  promise = nullptr;  // Just to be annoying, drop the original promise.

  EXPECT_EQ(0, callCount);
  EXPECT_EQ(0, chainedCallCount);

  auto response = pipelinePromise.wait(waitScope);
  EXPECT_EQ("bar", response.get("x").as<Text>());

  auto response2 = pipelinePromise2.wait(waitScope);
  checkTestMessage(response2);

  EXPECT_EQ(3, callCount);
  EXPECT_EQ(1, chainedCallCount);
}